

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

int main(void)

{
  char *pcVar1;
  ostream *poVar2;
  float fVar3;
  float fVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  vec_3d vVar5;
  euler eVar6;
  quaternion qVar7;
  quaternion q2;
  quaternion q1;
  vec_3d b;
  vec_3d a;
  quaternion quat;
  anon_union_4_2_313de162_for_euler__0 local_b8;
  anon_union_4_2_3dd69ce4_for_euler__2 aStack_b4;
  anon_union_4_2_0ec104fb_for_quaternion__0 local_a8;
  float fStack_a4;
  quaternion local_98;
  quaternion local_88;
  euler local_78;
  vec_3d local_68;
  vec_3d local_58;
  vec_3d local_48;
  quaternion local_38;
  
  local_48.x = 1.0;
  local_48.y = 2.0;
  local_48.z = 3.0;
  local_58.x = 1.0;
  local_58.y = 1.0;
  local_58.z = 1.0;
  pcVar1 = print_vector(&local_48,"a");
  std::operator<<((ostream *)&std::cout,pcVar1);
  pcVar1 = print_vector(&local_58,"b");
  std::operator<<((ostream *)&std::cout,pcVar1);
  fVar3 = operator~(&local_48);
  poVar2 = std::operator<<((ostream *)&std::cout,"|a| =");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,fVar3);
  std::operator<<(poVar2,"\n");
  fVar3 = operator~(&local_58);
  poVar2 = std::operator<<((ostream *)&std::cout,"|b| =");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,fVar3);
  std::operator<<(poVar2,"\n");
  fVar3 = operator*(&local_48,&local_58);
  poVar2 = std::operator<<((ostream *)&std::cout,"Dot product: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,fVar3);
  std::operator<<(poVar2,"\n");
  vVar5 = operator^(&local_48,&local_58);
  local_68.z = vVar5.z;
  local_68._0_8_ = vVar5._0_8_;
  std::operator<<((ostream *)&std::cout,"Vector product ");
  pcVar1 = print_vector(&local_68,"c");
  std::operator<<((ostream *)&std::cout,pcVar1);
  local_38._0_8_ = 0x3f3504813f350481;
  local_38.field_1._4_8_ = 0;
  eVar6 = euler_from_quat(&local_38);
  local_78._0_8_ = eVar6._0_8_;
  local_78.field_2 = eVar6.field_2;
  poVar2 = std::operator<<((ostream *)&std::cout,"Euler: ");
  aStack_b4 = eVar6.field_1;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,aStack_b4.pitch);
  poVar2 = std::operator<<(poVar2,", ");
  local_b8 = eVar6.field_0;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_b8.roll);
  poVar2 = std::operator<<(poVar2,", ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,eVar6.field_2.yaw);
  std::operator<<(poVar2,"\n");
  qVar7 = quat_from_euler(&local_78);
  poVar2 = std::operator<<((ostream *)&std::cout,"Quaternion: ");
  local_a8 = qVar7.field_0;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_a8.w);
  poVar2 = std::operator<<(poVar2,", ");
  fStack_a4 = qVar7.field_1._0_4_;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,fStack_a4);
  poVar2 = std::operator<<(poVar2,", ");
  local_b8 = qVar7.field_1._4_4_;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(float)local_b8);
  poVar2 = std::operator<<(poVar2,", ");
  aStack_b4 = qVar7.field_1._8_4_;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(float)aStack_b4);
  std::operator<<(poVar2,"\n");
  local_88._0_8_ = 0xbf8000003f800000;
  local_88.field_1._4_8_ = 0x3f800000bf800000;
  local_98._0_8_ = 0xbf800000bf800000;
  local_98.field_1._4_8_ = 0xbf800000bf800000;
  qVar7 = quaternion_multiply(&local_88,&local_98);
  poVar2 = std::operator<<((ostream *)&std::cout,"Quaternion: ");
  local_a8 = qVar7.field_0;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,local_a8.w);
  poVar2 = std::operator<<(poVar2,", ");
  fStack_a4 = qVar7.field_1._0_4_;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,fStack_a4);
  poVar2 = std::operator<<(poVar2,", ");
  local_b8 = qVar7.field_1._4_4_;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(float)local_b8);
  poVar2 = std::operator<<(poVar2,", ");
  aStack_b4 = qVar7.field_1._8_4_;
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,(float)aStack_b4);
  std::operator<<(poVar2,"\n");
  fVar3 = local_88.field_0.w * local_98.field_0.w;
  fVar4 = operator*(&local_88.field_1.dual,&local_98.field_1.dual);
  poVar2 = std::operator<<((ostream *)&std::cout,"Quaternion: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,fVar3 - fVar4);
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>((double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
  std::operator<<(poVar2,", ");
  poVar2 = std::ostream::_M_insert<double>
                     ((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
  std::operator<<(poVar2,"\n");
  return 0;
}

Assistant:

auto main() -> int {
    vec_3d a = {1.f, 2.f, 3.f};
    vec_3d b = {1.f, 1.f, 1.f};
    vec_3d c = {0.f};
    float d = 0.f;

    std::cout << print_vector(&a, "a");
    std::cout << print_vector(&b, "b");

    d = ~a;
    std::cout << "|a| =" << d << "\n";
    d = ~b;
    std::cout << "|b| =" << d << "\n";

    d = a * b;
    std::cout << "Dot product: " << d << "\n";

    c = a ^ b;
    std::cout << "Vector product ";
    std::cout << print_vector(&c, "c");

    quaternion quat = {0.7071f, 0.7071f, 0.f, 0.f};
    euler eul = {0.f};
    eul = euler_from_quat(&quat);
    std::cout << "Euler: " << eul.pitch << ", " << eul.roll << ", " << eul.yaw
              << "\n";

    quaternion test_quat;
    test_quat = quat_from_euler(&eul);
    std::cout << "Quaternion: " << test_quat.w << ", " << test_quat.dual.x
              << ", " << test_quat.dual.y << ", " << test_quat.dual.z << "\n";

    assert(fabsf(test_quat.q0 - quat.q0) < 0.1f);
    assert(fabsf(test_quat.q1 - quat.q1) < 0.1f);
    assert(fabsf(test_quat.q2 - quat.q2) < 0.1f);
    assert(fabsf(test_quat.q3 - quat.q3) < 0.1f);

    quaternion q1 = {1.f, -1.f, -1.f, 1.f};
    quaternion q2 = {-1.f, -1.f, -1.f, -1.f};
    quaternion q3 = quaternion_multiply(&q1, &q2);
    std::cout << "Quaternion: " << q3.q0 << ", " << q3.q1 << ", " << q3.q2
              << ", " << q3.q3 << "\n";

    quaternion q4;
    q4.w = q1.q0 * q2.q0 - (q1.dual * q2.dual);

    std::cout << "Quaternion: " << q4.q0 << ", " << q4.q1 << ", " << q4.q2
              << ", " << q4.q3 << "\n";

    return 0;
}